

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O0

Pass * wasm::createConstHoistingPass(void)

{
  ConstHoisting *this;
  
  this = (ConstHoisting *)operator_new(0x180);
  memset(this,0,0x180);
  ConstHoisting::ConstHoisting(this);
  return (Pass *)this;
}

Assistant:

Pass* createConstHoistingPass() { return new ConstHoisting(); }